

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.h
# Opt level: O3

void __thiscall clean_up_fixture::clean_up_fixture(clean_up_fixture *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  path local_78;
  error_code local_58;
  undefined1 local_48 [16];
  path local_38;
  
  boost::filesystem::detail::temp_directory_path((error_code *)&local_78);
  local_58._0_8_ = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"%%%%-%%%%-%%%%-%%%%","");
  boost::filesystem::detail::unique_path(&local_38,&local_58);
  boost::filesystem::path::operator/=(&local_78,&local_38);
  paVar1 = &(this->m_path).m_pathname.field_2;
  (this->m_path).m_pathname._M_dataplus._M_p = (pointer)paVar1;
  paVar2 = &local_78.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_pathname._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_78.m_pathname.field_2._M_allocated_capacity._1_7_,
                  local_78.m_pathname.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->m_path).m_pathname.field_2 + 8) =
         local_78.m_pathname.field_2._8_8_;
  }
  else {
    (this->m_path).m_pathname._M_dataplus._M_p = local_78.m_pathname._M_dataplus._M_p;
    (this->m_path).m_pathname.field_2._M_allocated_capacity =
         CONCAT71(local_78.m_pathname.field_2._M_allocated_capacity._1_7_,
                  local_78.m_pathname.field_2._M_local_buf[0]);
  }
  (this->m_path).m_pathname._M_string_length = local_78.m_pathname._M_string_length;
  local_78.m_pathname._M_string_length = 0;
  local_78.m_pathname.field_2._M_local_buf[0] = '\0';
  local_78.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_pathname._M_dataplus._M_p != &local_38.m_pathname.field_2) {
    operator_delete(local_38.m_pathname._M_dataplus._M_p);
  }
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.m_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

clean_up_fixture()
        : m_path(fs::temp_directory_path() / fs::unique_path()) {}